

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.c
# Opt level: O1

int http_parser_parse_url(char *buf,size_t buflen,int is_connect,http_parser_url *u)

{
  uint16_t *puVar1;
  byte bVar2;
  ushort uVar3;
  long lVar4;
  int iVar5;
  state s;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  char *pcVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  bool bVar15;
  
  iVar6 = 1;
  if (buflen != 0) {
    u->field_set = 0;
    u->port = 0;
    if ((long)buflen < 1) {
      iVar14 = 4;
    }
    else {
      s = (uint)(is_connect != 0) * 4 + s_req_spaces_before_url;
      uVar10 = 7;
      lVar9 = 0;
      bVar15 = false;
      do {
        s = parse_url_char(s,buf[lVar9]);
        switch(s) {
        case s_req_schema:
          uVar7 = 0;
          break;
        case s_req_schema_slash:
        case s_req_schema_slash_slash:
        case s_req_server_start:
        case s_req_query_string_start:
        case s_req_fragment_start:
          goto switchD_00108c9c_caseD_16;
        case s_req_server:
          uVar7 = 1;
          break;
        case s_req_server_with_at:
          uVar7 = 1;
          bVar15 = true;
          break;
        case s_req_path:
          uVar7 = 3;
          break;
        case s_req_query_string:
          uVar7 = 4;
          break;
        case s_req_fragment:
          uVar7 = 5;
          break;
        default:
          if (s == s_dead) {
            return 1;
          }
          __assert_fail("!\"Unexpected state\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/gatzka[P]cio/lib/cio/http-parser/http_parser.c"
                        ,0x9a9,
                        "int http_parser_parse_url(const char *, size_t, int, struct http_parser_url *)"
                       );
        }
        if (uVar7 == uVar10) {
          puVar1 = &u->field_data[uVar7].len;
          *puVar1 = *puVar1 + 1;
        }
        else {
          u->field_data[uVar7].off = (uint16_t)lVar9;
          u->field_data[uVar7].len = 1;
          u->field_set = u->field_set | (ushort)(1 << (sbyte)uVar7);
          uVar10 = uVar7;
        }
switchD_00108c9c_caseD_16:
        lVar4 = lVar9 + 1;
        lVar9 = lVar9 + 1;
      } while (buf + lVar4 < buf + buflen);
      iVar14 = (uint)!bVar15 * 2 + 2;
    }
    iVar6 = 1;
    if ((u->field_set & 3) != 1) {
      if ((u->field_set & 2) != 0) {
        uVar12 = (ulong)u->field_data[1].len;
        uVar8 = (ulong)u->field_data[1].off;
        u->field_data[1].len = 0;
        if (uVar12 != 0) {
          lVar9 = uVar12 + uVar8;
          do {
            if (10 < iVar14 - 2U) goto LAB_00108f75;
            bVar2 = buf[uVar8];
            uVar10 = (uint)bVar2;
            switch(iVar14) {
            default:
              if (bVar2 == 0x40) {
                iVar5 = 4;
                break;
              }
              bVar15 = false;
              iVar13 = 3;
              if ((9 < (byte)(bVar2 - 0x30)) && (0x19 < (byte)((bVar2 | 0x20) + 0x9f))) {
                bVar15 = false;
                iVar5 = 3;
                if ((bVar2 - 0x21 < 0x3f) &&
                   ((0x4000000016003ff9U >> ((ulong)(bVar2 - 0x21) & 0x3f) & 1) != 0))
                goto LAB_00108f7e;
                goto LAB_00108f11;
              }
              goto LAB_00108f7e;
            case 4:
              if (uVar10 == 0x5b) {
                iVar5 = 5;
              }
              else {
                iVar5 = 6;
                if ((0x19 < (byte)((bVar2 | 0x20) + 0x9f)) &&
                   (1 < (byte)(bVar2 - 0x2d) && 9 < (byte)(bVar2 - 0x30))) goto LAB_00108f75;
              }
              break;
            case 5:
switchD_00108da7_caseD_5:
              iVar13 = 7;
              iVar5 = 7;
              if (9 < (byte)(bVar2 - 0x30)) {
                if ((bVar2 | 0x20) < 0x61) {
                  bVar15 = false;
                  if ((uVar10 == 0x2e) || (uVar10 == 0x3a)) goto LAB_00108f7e;
                }
                else if ((bVar2 | 0x20) < 0x67) break;
                if ((iVar14 == 7) && (bVar2 == 0x25)) {
                  bVar15 = false;
                  iVar13 = 9;
                  goto LAB_00108f7e;
                }
                goto LAB_00108f75;
              }
              break;
            case 6:
              iVar5 = 6;
              if ((0x19 < (byte)((bVar2 | 0x20) + 0x9f)) &&
                 (1 < (byte)(bVar2 - 0x2d) && 9 < (byte)(bVar2 - 0x30)))
              goto switchD_00108da7_caseD_8;
              break;
            case 7:
              if (uVar10 != 0x5d) goto switchD_00108da7_caseD_5;
LAB_00108ec6:
              iVar5 = 8;
              break;
            case 8:
switchD_00108da7_caseD_8:
              if (uVar10 != 0x3a) goto LAB_00108f75;
              iVar5 = 0xb;
              break;
            case 9:
              goto switchD_00108da7_caseD_9;
            case 10:
              if (uVar10 == 0x5d) goto LAB_00108ec6;
              goto switchD_00108da7_caseD_9;
            case 0xb:
            case 0xc:
              if (9 < (byte)(bVar2 - 0x30)) goto LAB_00108f75;
              iVar5 = 0xc;
            }
            iVar13 = iVar5;
            bVar15 = false;
LAB_00108f7e:
            if ((!bVar15) && (iVar14 = iVar13, iVar13 - 3U < 10)) {
              iVar6 = (*(code *)(&DAT_0010a9b4 + *(int *)(&DAT_0010a9b4 + (ulong)(iVar13 - 3U) * 4))
                      )();
              return iVar6;
            }
            if (bVar15) {
              return 1;
            }
            lVar4 = uVar8 + 1;
            uVar8 = uVar8 + 1;
          } while (buf + lVar4 < buf + lVar9);
        }
        if ((iVar14 - 2U < 10) && ((0x3afU >> (iVar14 - 2U & 0x1f) & 1) != 0)) {
          return 1;
        }
      }
      if ((is_connect == 0) || (u->field_set == 6)) {
        if ((u->field_set & 4) != 0) {
          uVar8 = (ulong)u->field_data[2].off;
          uVar3 = u->field_data[2].len;
          if (buflen < uVar3 + uVar8) {
            __assert_fail("off + len <= buflen && \"Port number overflow\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/gatzka[P]cio/lib/cio/http-parser/http_parser.c"
                          ,0x9d8,
                          "int http_parser_parse_url(const char *, size_t, int, struct http_parser_url *)"
                         );
          }
          bVar15 = uVar3 != 0;
          if (uVar3 == 0) {
            uVar12 = 0;
LAB_001090bf:
            u->port = (uint16_t)uVar12;
          }
          else {
            uVar12 = (long)buf[uVar8] - 0x30;
            if (uVar12 < 0x10000) {
              pcVar11 = buf + uVar8;
              do {
                pcVar11 = pcVar11 + 1;
                bVar15 = pcVar11 < buf + uVar8 + uVar3;
                if (!bVar15) goto LAB_001090bf;
                uVar12 = ((long)*pcVar11 + uVar12 * 10) - 0x30;
              } while (uVar12 < 0x10000);
            }
          }
          if (bVar15) {
            return 1;
          }
        }
        iVar6 = 0;
      }
    }
  }
  return iVar6;
switchD_00108da7_caseD_9:
  iVar13 = 10;
  bVar15 = false;
  if ((9 < (byte)(bVar2 - 0x30)) && (bVar15 = false, 0x19 < (byte)((bVar2 | 0x20) + 0x9f))) {
    bVar15 = false;
    iVar5 = 10;
    if ((0x3a < uVar10 - 0x25) || ((0x400000000000301U >> ((ulong)(uVar10 - 0x25) & 0x3f) & 1) == 0)
       ) {
LAB_00108f11:
      iVar13 = iVar5;
      bVar15 = false;
      if (uVar10 != 0x7e) {
LAB_00108f75:
        iVar13 = 1;
        bVar15 = true;
      }
    }
  }
  goto LAB_00108f7e;
}

Assistant:

int
http_parser_parse_url(const char *buf, size_t buflen, int is_connect,
                      struct http_parser_url *u)
{
  enum state s;
  const char *p;
  enum http_parser_url_fields uf, old_uf;
  int found_at = 0;

  if (buflen == 0) {
    return 1;
  }

  u->port = u->field_set = 0;
  s = is_connect ? s_req_server_start : s_req_spaces_before_url;
  old_uf = UF_MAX;

  for (p = buf; p < buf + buflen; p++) {
    s = parse_url_char(s, *p);

    /* Figure out the next field that we're operating on */
    switch (s) {
      case s_dead:
        return 1;

      /* Skip delimeters */
      case s_req_schema_slash:
      case s_req_schema_slash_slash:
      case s_req_server_start:
      case s_req_query_string_start:
      case s_req_fragment_start:
        continue;

      case s_req_schema:
        uf = UF_SCHEMA;
        break;

      case s_req_server_with_at:
        found_at = 1;

      /* fall through */
      case s_req_server:
        uf = UF_HOST;
        break;

      case s_req_path:
        uf = UF_PATH;
        break;

      case s_req_query_string:
        uf = UF_QUERY;
        break;

      case s_req_fragment:
        uf = UF_FRAGMENT;
        break;

      default:
        assert(!"Unexpected state");
        return 1;
    }

    /* Nothing's changed; soldier on */
    if (uf == old_uf) {
      u->field_data[uf].len++;
      continue;
    }

    u->field_data[uf].off = (uint16_t)(p - buf);
    u->field_data[uf].len = 1;

    u->field_set |= (1 << uf);
    old_uf = uf;
  }

  /* host must be present if there is a schema */
  /* parsing http:///toto will fail */
  if ((u->field_set & (1 << UF_SCHEMA)) &&
      (u->field_set & (1 << UF_HOST)) == 0) {
    return 1;
  }

  if (u->field_set & (1 << UF_HOST)) {
    if (http_parse_host(buf, u, found_at) != 0) {
      return 1;
    }
  }

  /* CONNECT requests can only contain "hostname:port" */
  if (is_connect && u->field_set != ((1 << UF_HOST)|(1 << UF_PORT))) {
    return 1;
  }

  if (u->field_set & (1 << UF_PORT)) {
    uint16_t off;
    uint16_t len;
    const char* p;
    const char* end;
    unsigned long v;

    off = u->field_data[UF_PORT].off;
    len = u->field_data[UF_PORT].len;
    end = buf + off + len;

    /* NOTE: The characters are already validated and are in the [0-9] range */
    assert(off + len <= buflen && "Port number overflow");
    v = 0;
    for (p = buf + off; p < end; p++) {
      v *= 10;
      v += *p - '0';

      /* Ports have a max value of 2^16 */
      if (v > 0xffff) {
        return 1;
      }
    }

    u->port = (uint16_t) v;
  }

  return 0;
}